

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine.cpp
# Opt level: O3

uint Engine::getRestartLimit(uint i)

{
  byte bVar1;
  Options *pOVar2;
  uint uVar3;
  ulong uVar4;
  double dVar5;
  
  uVar3 = so.restart_scale;
  uVar4 = (ulong)i;
  pOVar2 = &so;
  switch(so.restart_type) {
  case NONE:
    if (i < 2) {
      return 0xffffffff;
    }
    getRestartLimit();
  case LUBY:
    while( true ) {
      bVar1 = 0;
      uVar3 = (uint)uVar4;
      if (uVar3 != 1) {
        bVar1 = 0;
        do {
          bVar1 = bVar1 + 1;
        } while (1 < uVar3 >> (bVar1 & 0x1f));
      }
      if ((-1 << (bVar1 + 1 & 0x1f) ^ uVar3) == 0xffffffff) break;
      uVar4 = (ulong)(uVar3 + (-1 << (bVar1 & 0x1f)) + 1);
    }
    uVar3 = (int)(1L << (bVar1 & 0x3f)) * pOVar2->restart_scale;
    break;
  case CONSTANT:
    break;
  case GEOMETRIC:
    dVar5 = pow(so.restart_base,(double)i);
    uVar3 = (int)dVar5 * uVar3;
    break;
  default:
    uVar3 = i + 1 >> 1;
    i = (~uVar3 & uVar3 - 1) + 1;
  case LINEAR:
    uVar3 = i * so.restart_scale;
  }
  return uVar3;
}

Assistant:

unsigned int Engine::getRestartLimit(unsigned int i) {
	switch (so.restart_type) {
		case NONE:
			if (i > 1) {
				CHUFFED_ERROR("A restart occurred while using search without restarts");
			}
			return UINT_MAX;
		case CONSTANT:
			return so.restart_scale;
		case LINEAR:
			return i * so.restart_scale;
		case LUBY:
			while (true) {
				unsigned int exp = 0U;
				if (i != 1U) {
					while ((i >> (++exp)) > 1U) {
					}
				}
				if (i == (1U << (exp + 1)) - 1) {
					return static_cast<int>(1UL << exp) * so.restart_scale;
				}
				i = i - (1U << exp) + 1;
			}
		case GEOMETRIC:
			return so.restart_scale * ((int)pow(so.restart_base, i));
		default:
			i = (i + 1) / 2;
			return (((i - 1) & ~i) + 1) * so.restart_scale;
	}
	NEVER;
}